

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O3

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *psVar1;
  cmMakefile *pcVar2;
  int iVar3;
  string *psVar4;
  undefined8 *puVar5;
  long *plVar6;
  cmSourceFile *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  size_type sVar10;
  string *psVar11;
  undefined1 uVar12;
  value_type *__x;
  pointer pcVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  value_type *pvVar16;
  pointer pbVar17;
  string *unaff_R15;
  string sourceListValue;
  string functionMapCode;
  string driver;
  string extraInclude;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string configFile;
  string function;
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  cmCommand *local_1b0;
  string local_1a8;
  string local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  undefined1 local_160 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  string local_138;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  cmNewLineStyle local_dc;
  string local_d8;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_38;
  
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1b0 = &this->super_cmCommand;
  local_168 = args;
  if ((ulong)((long)pvVar16 - (long)__x) < 0x41) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"called with wrong number of arguments.","");
    cmCommand::SetError(local_1b0,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    uVar12 = 0;
  }
  else {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88 = '\0';
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    if (__x != pvVar16) {
      unaff_R15 = (string *)0x4e556b;
      do {
        iVar3 = std::__cxx11::string::compare((char *)__x);
        if (iVar3 == 0) {
          pvVar16 = __x + 1;
          if (pvVar16 ==
              (local_168->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_188,"incorrect arguments to EXTRA_INCLUDE","");
            cmCommand::SetError(local_1b0,&local_188);
            goto LAB_002313fa;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_118,0,(char *)local_118._M_string_length,0x4e5549);
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)__x[1]._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_118);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)__x);
          if (iVar3 == 0) {
            pvVar16 = __x + 1;
            if (pvVar16 ==
                (local_168->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_188,"incorrect arguments to FUNCTION","");
              cmCommand::SetError(local_1b0,&local_188);
              goto LAB_002313fa;
            }
            std::__cxx11::string::_M_assign((string *)&local_98);
            std::__cxx11::string::append((char *)&local_98);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_f8,__x);
            pvVar16 = __x;
          }
        }
        __x = pvVar16 + 1;
      } while (__x != (local_168->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar17 = local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = ((local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&local_188,
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    paVar8 = &local_188.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar8) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    local_188._M_dataplus._M_p = (pointer)paVar8;
    if (local_188._M_string_length < 2) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,"You must specify a file extension for the test driver file.",
                 "");
      cmCommand::SetError(local_1b0,&local_188);
LAB_002313fa:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      uVar12 = 0;
    }
    else {
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_1b0->Makefile);
      pcVar13 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar13,pcVar13 + psVar4->_M_string_length);
      std::__cxx11::string::append((char *)&local_188);
      std::__cxx11::string::_M_append((char *)&local_188,(ulong)pbVar17[1]._M_dataplus._M_p);
      psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar13 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar13,pcVar13 + psVar4->_M_string_length);
      std::__cxx11::string::append((char *)&local_b8);
      psVar4 = pbVar17 + 2;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
      if (psVar4 == local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_local_buf[0] = '\0';
        local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p;
      }
      else {
        local_140 = &local_1a8.field_2;
        psVar1 = (string *)(local_1f0 + 0x10);
        unaff_R15 = psVar4;
        do {
          iVar3 = std::__cxx11::string::compare((char *)unaff_R15);
          if (iVar3 == 0) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            local_1a8._M_string_length = 0;
            local_1a8.field_2._M_local_buf[0] = '\0';
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p;
            if (psVar4 == local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00230fd3;
            break;
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          local_1a8._M_string_length = 0;
          local_1a8.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetFilenamePath((string *)local_1f0,unaff_R15);
          uVar14 = local_1f0._8_8_;
          if ((string *)local_1f0._0_8_ != psVar1) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
          }
          if (uVar14 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_1f0,unaff_R15);
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_1f0);
            pcVar13 = (pointer)local_1f0._16_8_;
            psVar11 = (string *)local_1f0._0_8_;
            if ((string *)local_1f0._0_8_ != psVar1) goto LAB_00230b48;
          }
          else {
            cmsys::SystemTools::GetFilenamePath((string *)local_160,unaff_R15);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)local_160);
            local_1d0._M_allocated_capacity = (size_type)&local_1c0;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 == paVar8) {
              local_1c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_1c0._8_8_ = puVar5[3];
            }
            else {
              local_1c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_1d0._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_1d0._8_8_ = puVar5[1];
            *puVar5 = paVar8;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,unaff_R15);
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_allocated_capacity != &local_1c0) {
              uVar14 = local_1c0._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_138._M_string_length + local_1d0._8_8_) {
              uVar14 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&local_138 + 0x10U)) {
                uVar14 = local_138.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar14 < local_138._M_string_length + local_1d0._8_8_) goto LAB_00230a6b;
              plVar6 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_138,0,(char *)0x0,
                                          local_1d0._M_allocated_capacity);
            }
            else {
LAB_00230a6b:
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         (local_1d0._M_local_buf,(ulong)local_138._M_dataplus._M_p);
            }
            psVar11 = (string *)(plVar6 + 2);
            if ((string *)*plVar6 == psVar11) {
              local_1f0._16_8_ = (psVar11->_M_dataplus)._M_p;
              local_1f0._24_8_ = plVar6[3];
              local_1f0._0_8_ = psVar1;
            }
            else {
              local_1f0._16_8_ = (psVar11->_M_dataplus)._M_p;
              local_1f0._0_8_ = (string *)*plVar6;
            }
            local_1f0._8_8_ = plVar6[1];
            *plVar6 = (long)psVar11;
            plVar6[1] = 0;
            *(undefined1 *)&(psVar11->_M_dataplus)._M_p = 0;
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_1f0);
            if ((string *)local_1f0._0_8_ != psVar1) {
              operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_138 + 0x10U)) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_allocated_capacity != &local_1c0) {
              operator_delete((void *)local_1d0._M_allocated_capacity,
                              local_1c0._M_allocated_capacity + 1);
            }
            pcVar13 = (pointer)local_160._16_8_;
            psVar11 = (string *)local_160._0_8_;
            if ((string *)local_160._0_8_ != (string *)(local_160 + 0x10)) {
LAB_00230b48:
              operator_delete(psVar11,(ulong)(pcVar13 + 1));
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_1a8);
          if (local_1a8._M_string_length != 0) {
            sVar10 = 0;
            do {
              if (local_1a8._M_dataplus._M_p[sVar10] == ' ') {
                local_1a8._M_dataplus._M_p[sVar10] = '_';
              }
              sVar10 = sVar10 + 1;
            } while (local_1a8._M_string_length != sVar10);
            if (local_1a8._M_string_length != 0) {
              sVar10 = 0;
              do {
                if (local_1a8._M_dataplus._M_p[sVar10] == '/') {
                  local_1a8._M_dataplus._M_p[sVar10] = '_';
                }
                sVar10 = sVar10 + 1;
              } while (local_1a8._M_string_length != sVar10);
              if (local_1a8._M_string_length != 0) {
                sVar10 = 0;
                do {
                  if (local_1a8._M_dataplus._M_p[sVar10] == ':') {
                    local_1a8._M_dataplus._M_p[sVar10] = '_';
                  }
                  sVar10 = sVar10 + 1;
                } while (local_1a8._M_string_length != sVar10);
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_58,&local_1a8);
          std::__cxx11::string::append((char *)&local_78);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_1a8._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                     local_1a8.field_2._M_local_buf[0]) + 1);
          }
          unaff_R15 = unaff_R15 + 1;
        } while (unaff_R15 !=
                 local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_1a8.field_2._M_local_buf[0] = '\0';
        local_1a8._M_string_length = 0;
        psVar11 = psVar4;
        pbVar17 = local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1f0._8_8_ = 0;
          local_1f0._16_8_ = local_1f0._16_8_ & 0xffffffffffffff00;
          local_1f0._0_8_ = psVar1;
          cmsys::SystemTools::GetFilenamePath((string *)&local_1d0,psVar11);
          uVar14 = local_1d0._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_allocated_capacity != &local_1c0) {
            operator_delete((void *)local_1d0._M_allocated_capacity,
                            local_1c0._M_allocated_capacity + 1);
          }
          if (uVar14 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_1d0,psVar11);
            std::__cxx11::string::operator=((string *)local_1f0,(string *)local_1d0._M_local_buf);
            uVar14 = local_1c0._M_allocated_capacity;
            uVar15 = local_1d0._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_allocated_capacity != &local_1c0) goto LAB_00230f4a;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_138,psVar11);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
            local_160._0_8_ = local_160 + 0x10;
            psVar9 = (string *)(plVar6 + 2);
            if ((string *)*plVar6 == psVar9) {
              local_160._16_8_ = (psVar9->_M_dataplus)._M_p;
              local_160._24_8_ = plVar6[3];
            }
            else {
              local_160._16_8_ = (psVar9->_M_dataplus)._M_p;
              local_160._0_8_ = (string *)*plVar6;
            }
            local_160._8_8_ = plVar6[1];
            *plVar6 = (long)psVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_d8,psVar11);
            pcVar13 = (pointer)0xf;
            if ((string *)local_160._0_8_ != (string *)(local_160 + 0x10)) {
              pcVar13 = (pointer)local_160._16_8_;
            }
            if (pcVar13 < (pointer)(local_d8._M_string_length + local_160._8_8_)) {
              uVar14 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar14 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar14 < (pointer)(local_d8._M_string_length + local_160._8_8_))
              goto LAB_00230e50;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_160._0_8_)
              ;
            }
            else {
LAB_00230e50:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append(local_160,(ulong)local_d8._M_dataplus._M_p);
            }
            local_1d0._M_allocated_capacity = (size_type)&local_1c0;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 == paVar8) {
              local_1c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_1c0._8_8_ = puVar5[3];
            }
            else {
              local_1c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_1d0._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_1d0._8_8_ = puVar5[1];
            *puVar5 = paVar8;
            puVar5[1] = 0;
            paVar8->_M_local_buf[0] = '\0';
            std::__cxx11::string::operator=((string *)local_1f0,(string *)local_1d0._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_allocated_capacity != &local_1c0) {
              operator_delete((void *)local_1d0._M_allocated_capacity,
                              local_1c0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              (ulong)(local_d8.field_2._M_allocated_capacity + 1));
            }
            if ((string *)local_160._0_8_ != (string *)(local_160 + 0x10)) {
              operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
            }
            uVar14 = local_138.field_2._M_allocated_capacity;
            uVar15 = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_138 + 0x10U)) {
LAB_00230f4a:
              operator_delete((void *)uVar15,uVar14 + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1a8,local_1f0._0_8_);
          std::__cxx11::string::append((char *)&local_1a8);
          std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(pbVar17->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_1a8);
          if ((string *)local_1f0._0_8_ != psVar1) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
          }
          psVar11 = psVar11 + 1;
          pbVar17 = pbVar17 + 1;
          unaff_R15 = psVar1;
        } while (psVar11 !=
                 local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_00230fd3:
      if ((char *)local_118._M_string_length != (char *)0x0) {
        pcVar2 = local_1b0->Makefile;
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        cmMakefile::AddDefinition(pcVar2,(string *)local_1f0,local_118._M_dataplus._M_p);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
        }
      }
      if (local_90 != 0) {
        pcVar2 = local_1b0->Makefile;
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1f0,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        cmMakefile::AddDefinition(pcVar2,(string *)local_1f0,local_98);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
        }
      }
      pcVar2 = local_1b0->Makefile;
      psVar1 = (string *)(local_1f0 + 0x10);
      local_1f0._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,"CMAKE_FORWARD_DECLARE_TESTS","");
      cmMakefile::AddDefinition(pcVar2,(string *)local_1f0,local_78);
      if ((string *)local_1f0._0_8_ != psVar1) {
        operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
      }
      pcVar2 = local_1b0->Makefile;
      local_1f0._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,"CMAKE_FUNCTION_TABLE_ENTIRES","");
      cmMakefile::AddDefinition(pcVar2,(string *)local_1f0,local_1a8._M_dataplus._M_p);
      if ((string *)local_1f0._0_8_ != psVar1) {
        operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
      }
      pcVar2 = local_1b0->Makefile;
      cmNewLineStyle::cmNewLineStyle(&local_dc);
      iVar3 = cmMakefile::ConfigureFile(pcVar2,&local_b8,&local_188,false,true,false,local_dc);
      local_1f0._8_8_ = 0;
      local_1f0._16_8_ = local_1f0._16_8_ & 0xffffffffffffff00;
      local_1f0._0_8_ = psVar1;
      pcVar7 = cmMakefile::GetOrCreateSource(local_1b0->Makefile,&local_188,false,Ambiguous);
      local_1d0._M_allocated_capacity = (size_type)&local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar7,(string *)&local_1d0,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_allocated_capacity != &local_1c0) {
        operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._M_allocated_capacity + 1)
        ;
      }
      std::__cxx11::string::_M_assign((string *)local_1f0);
      local_168 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(local_168._4_4_,
                              (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),iVar3 != 0));
      if (psVar4 != local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar7 = cmMakefile::GetOrCreateSource(local_1b0->Makefile,psVar4,false,Ambiguous);
          local_1d0._M_allocated_capacity = (size_type)&local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar7,(string *)&local_1d0,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_allocated_capacity != &local_1c0) {
            operator_delete((void *)local_1d0._M_allocated_capacity,
                            local_1c0._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_1f0);
          std::__cxx11::string::_M_append(local_1f0,(ulong)(psVar4->_M_dataplus)._M_p);
          psVar4 = psVar4 + 1;
        } while (psVar4 != local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar2 = local_1b0->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0._M_local_buf,local_38,(allocator<char> *)local_160);
      cmMakefile::AddDefinition(pcVar2,(string *)&local_1d0,(char *)local_1f0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_allocated_capacity != &local_1c0) {
        operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._M_allocated_capacity + 1)
        ;
      }
      uVar12 = local_168._0_1_;
      if ((string *)local_1f0._0_8_ != (string *)(local_1f0 + 0x10)) {
        operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != local_140) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                                 local_1a8.field_2._M_local_buf[0]) + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)uVar12;
}

Assistant:

bool cmCreateTestSourceList::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with wrong number of arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = *i;
      function += "(&ac, &av);\n";
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    std::replace(func_name.begin(), func_name.end(), ' ', '_');
    std::replace(func_name.begin(), func_name.end(), '/', '_');
    std::replace(func_name.begin(), func_name.end(), ':', '_');
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
  }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
    numTests++;
  }
  if (!extraInclude.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
  }
  if (!function.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
  }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
                                forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
                                functionMapCode.c_str());
  bool res = true;
  if (!this->Makefile->ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}